

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O0

DAngle __thiscall DBot::FireRox(DBot *this,AActor *enemy,ticcmd_t *cmd)

{
  bool bVar1;
  AActor *pAVar2;
  double in_RCX;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa_00;
  DAngle DVar5;
  double extraout_XMM0_Qa_01;
  undefined1 local_198 [8];
  FCheckPosition tm;
  DVector3 local_e8;
  TVector3<double> local_d0;
  TVector2<double> local_b8;
  TVector3<double> local_a8;
  undefined1 local_90 [32];
  DVector3 local_70;
  TVector3<double> local_58;
  double local_40;
  double m;
  AActor *actor;
  double dist;
  ticcmd_t *cmd_local;
  AActor *enemy_local;
  DBot *this_local;
  
  dist = in_RCX;
  cmd_local = cmd;
  enemy_local = enemy;
  this_local = this;
  AActor::PosPlusZ(&local_70,(AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                   (double)(enemy->snext->super_DThinker).super_DObject._vptr_DObject[0x30] / 2.0);
  TVector3<double>::XY((TVector3<double> *)local_90);
  ::operator*((TVector2<double> *)(local_90 + 0x10),5.0);
  operator+(&local_58,&local_70,(Vector2 *)(local_90 + 0x10));
  FCajunMaster::SetBodyAt(&bglobal,&local_58,2);
  m = (double)::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&bglobal.body2);
  actor = (AActor *)AActor::Distance2D((AActor *)m,(AActor *)cmd_local,false);
  if ((double)actor < 140.0) {
    TAngle<double>::TAngle((TAngle<double> *)this,0.0);
    return (DAngle)extraout_XMM0_Qa;
  }
  dVar3 = (double)actor + 1.0;
  pAVar2 = GetDefaultByName("Rocket");
  local_40 = dVar3 / pAVar2->Speed;
  AActor::Pos(&local_e8,(AActor *)cmd_local);
  ::operator*((TVector3<double> *)&tm.DoRipping,(TVector3<double> *)(cmd_local + 10),local_40 + 2.0)
  ;
  TVector3<double>::operator+(&local_d0,&local_e8,(TVector3<double> *)&tm.DoRipping);
  TVector2<double>::TVector2(&local_b8,&local_d0);
  TVector3<double>::TVector3(&local_a8,&local_b8,-2147483648.0);
  FCajunMaster::SetBodyAt(&bglobal,&local_a8,1);
  dVar3 = m;
  pAVar2 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&bglobal.body1);
  bVar1 = P_CheckSight((AActor *)dVar3,pAVar2,1);
  if (!bVar1) goto LAB_00433720;
  FCheckPosition::FCheckPosition((FCheckPosition *)local_198,false);
  pAVar2 = (AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject;
  dVar3 = AActor::X((AActor *)m);
  dVar4 = AActor::Y((AActor *)m);
  bVar1 = FCajunMaster::SafeCheckPosition(&bglobal,pAVar2,dVar3,dVar4,(FCheckPosition *)local_198);
  dVar3 = m;
  if (bVar1) {
    pAVar2 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&bglobal.body1);
    dVar4 = FCajunMaster::FakeFire(&bglobal,(AActor *)dVar3,pAVar2,(ticcmd_t *)dist);
    dVar3 = m;
    if (dVar4 < 140.0) goto LAB_004336fa;
    pAVar2 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&bglobal.body1);
    AActor::AngleTo((AActor *)this,(AActor *)dVar3,SUB81(pAVar2,0));
    bVar1 = true;
  }
  else {
LAB_004336fa:
    bVar1 = false;
  }
  FCheckPosition::~FCheckPosition((FCheckPosition *)local_198);
  if (bVar1) {
    return (DAngle)extraout_XMM0_Qa_00;
  }
LAB_00433720:
  bVar1 = P_CheckSight((AActor *)m,(AActor *)cmd_local,0);
  if ((!bVar1) ||
     (dVar3 = FCajunMaster::FakeFire
                        (&bglobal,(AActor *)
                                  (enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                         (AActor *)cmd_local,(ticcmd_t *)dist), dVar3 < 140.0)) {
    TAngle<double>::TAngle((TAngle<double> *)this,0.0);
    DVar5.Degrees = extraout_XMM0_Qa_01;
  }
  else {
    DVar5 = AActor::AngleTo((AActor *)this,
                            (AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                            SUB81(cmd_local,0));
  }
  return (DAngle)DVar5.Degrees;
}

Assistant:

DAngle DBot::FireRox (AActor *enemy, ticcmd_t *cmd)
{
	double dist;
	AActor *actor;
	double m;

	bglobal.SetBodyAt(player->mo->PosPlusZ(player->mo->Height / 2) + player->mo->Vel.XY() * 5, 2);

	actor = bglobal.body2;

	dist = actor->Distance2D (enemy);
	if (dist < SAFE_SELF_MISDIST)
		return 0.;
	//Predict.
	m = ((dist+1) / GetDefaultByName("Rocket")->Speed);

	bglobal.SetBodyAt(DVector3((enemy->Pos() + enemy->Vel * (m + 2)), ONFLOORZ), 1);
	
	//try the predicted location
	if (P_CheckSight (actor, bglobal.body1, SF_IGNOREVISIBILITY)) //See the predicted location, so give a test missile
	{
		FCheckPosition tm;
		if (bglobal.SafeCheckPosition (player->mo, actor->X(), actor->Y(), tm))
		{
			if (bglobal.FakeFire (actor, bglobal.body1, cmd) >= SAFE_SELF_MISDIST)
			{
				return actor->AngleTo(bglobal.body1);
			}
		}
	}
	//Try fire straight.
	if (P_CheckSight (actor, enemy, 0))
	{
		if (bglobal.FakeFire (player->mo, enemy, cmd) >= SAFE_SELF_MISDIST)
		{
			return player->mo->AngleTo(enemy);
		}
	}
	return 0.;
}